

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::insertSpirvExecutionMode
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  undefined8 *puVar1;
  int iVar2;
  TSpirvExecutionMode *this_00;
  undefined4 extraout_var;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  *this_01;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  int executionMode_local;
  TIntermConstantUnion *extraOperand;
  TVector<const_glslang::TIntermConstantUnion_*> extraOperands;
  
  executionMode_local = executionMode;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    this_00 = (TSpirvExecutionMode *)
              TSpirvExecutionMode::operator_new
                        ((TSpirvExecutionMode *)0x70,CONCAT44(in_register_00000034,executionMode));
    TSpirvExecutionMode::TSpirvExecutionMode(this_00);
    this->spirvExecutionMode = this_00;
  }
  TVector<const_glslang::TIntermConstantUnion_*>::TVector(&extraOperands);
  if (args != (TIntermAggregate *)0x0) {
    iVar2 = (*(args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(args);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 0x10);
    for (puVar3 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 8); puVar3 != puVar1;
        puVar3 = puVar3 + 1) {
      extraOperand = (TIntermConstantUnion *)(**(code **)(*(long *)*puVar3 + 0x28))();
      if (extraOperand == (TIntermConstantUnion *)0x0) {
        __assert_fail("extraOperand != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x7f,
                      "void glslang::TIntermediate::insertSpirvExecutionMode(int, const TIntermAggregate *)"
                     );
      }
      std::
      vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ::push_back(&extraOperands.
                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ,&extraOperand);
    }
  }
  this_01 = &std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::operator[]((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                           *)this->spirvExecutionMode,&executionMode_local)->
             super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ;
  std::
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ::operator=(this_01,&extraOperands.
                       super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
             );
  return;
}

Assistant:

void TIntermediate::insertSpirvExecutionMode(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    TVector<const TIntermConstantUnion*> extraOperands;
    if (args) {
        for (auto arg : args->getSequence()) {
            auto extraOperand = arg->getAsConstantUnion();
            assert(extraOperand != nullptr);
            extraOperands.push_back(extraOperand);
        }
    }
    spirvExecutionMode->modes[executionMode] = extraOperands;
}